

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTreeWalker.cpp
# Opt level: O1

void __thiscall
GrcManager::WalkTableElement
          (GrcManager *this,RefAST *ast,TableType tblt,GdlRuleTable *prultbl,GdlPass *ppass)

{
  int iVar1;
  GdlPass *pGVar2;
  RefAST *ast_00;
  RefAST local_78;
  RefAST local_70;
  RefAST local_68;
  RefAST local_60;
  RefAST local_58;
  RefAST local_50;
  RefAST local_48;
  RefAST local_40;
  RefAST local_38;
  RefAST local_30;
  
  ast_00 = &local_78;
  pGVar2 = (GdlPass *)prultbl;
  iVar1 = AST::getType(ast->ref->ptr);
  if (iVar1 < 0x59) {
    if (iVar1 == 9) {
      local_30 = (RefAST)ast->ref;
      if (local_30.ref == (Ref *)0x0) {
        local_30.ref = (Ref *)0x0;
      }
      else {
        (local_30.ref)->count = (local_30.ref)->count + 1;
      }
      ast_00 = &local_30;
      WalkEnvTree(this,ast_00,tblt,prultbl,ppass);
    }
    else if (iVar1 == 0xe) {
      local_38 = (RefAST)ast->ref;
      if (local_38.ref == (Ref *)0x0) {
        local_38.ref = (Ref *)0x0;
      }
      else {
        (local_38.ref)->count = (local_38.ref)->count + 1;
      }
      ast_00 = &local_38;
      WalkTableTree(this,ast_00);
    }
    else if (iVar1 == 0x26) {
      local_48 = (RefAST)ast->ref;
      if (local_48.ref == (Ref *)0x0) {
        local_48.ref = (Ref *)0x0;
      }
      else {
        (local_48.ref)->count = (local_48.ref)->count + 1;
      }
      ast_00 = &local_48;
      WalkPassTree(this,ast_00,prultbl,pGVar2);
    }
    else {
code_r0x001ccf49:
      switch(tblt) {
      case ktbltName:
        local_70 = (RefAST)ast->ref;
        if (local_70.ref == (Ref *)0x0) {
          local_70.ref = (Ref *)0x0;
        }
        else {
          (local_70.ref)->count = (local_70.ref)->count + 1;
        }
        ast_00 = &local_70;
        WalkNameTableElement(this,ast_00);
        break;
      case ktbltFeature:
        local_60 = (RefAST)ast->ref;
        if (local_60.ref == (Ref *)0x0) {
          local_60.ref = (Ref *)0x0;
        }
        else {
          (local_60.ref)->count = (local_60.ref)->count + 1;
        }
        ast_00 = &local_60;
        WalkFeatureTableElement(this,ast_00);
        break;
      case ktbltGlyph:
        local_78 = (RefAST)ast->ref;
        if (local_78.ref == (Ref *)0x0) {
          local_78.ref = (Ref *)0x0;
        }
        else {
          (local_78.ref)->count = (local_78.ref)->count + 1;
        }
        WalkGlyphTableElement(this,&local_78);
        break;
      default:
        goto switchD_001ccf57_caseD_4;
      case ktbltLanguage:
        local_68 = (RefAST)ast->ref;
        if (local_68.ref == (Ref *)0x0) {
          local_68.ref = (Ref *)0x0;
        }
        else {
          (local_68.ref)->count = (local_68.ref)->count + 1;
        }
        ast_00 = &local_68;
        WalkLanguageTableElement(this,ast_00);
      }
    }
  }
  else if (iVar1 == 0x59) {
    local_40 = (RefAST)ast->ref;
    if (local_40.ref == (Ref *)0x0) {
      local_40.ref = (Ref *)0x0;
    }
    else {
      (local_40.ref)->count = (local_40.ref)->count + 1;
    }
    ast_00 = &local_40;
    WalkDirectivesTree(this,ast_00,(int *)0x0,(int *)0x0,(int *)0x0,(int *)0x0);
  }
  else if (iVar1 == 0x5d) {
    local_50 = (RefAST)ast->ref;
    if (local_50.ref == (Ref *)0x0) {
      local_50.ref = (Ref *)0x0;
    }
    else {
      (local_50.ref)->count = (local_50.ref)->count + 1;
    }
    ast_00 = &local_50;
    WalkIfTree(this,ast_00,prultbl,ppass);
  }
  else {
    if (iVar1 != 0x61) goto code_r0x001ccf49;
    local_58 = (RefAST)ast->ref;
    if (local_58.ref == (Ref *)0x0) {
      local_58.ref = (Ref *)0x0;
    }
    else {
      (local_58.ref)->count = (local_58.ref)->count + 1;
    }
    ast_00 = &local_58;
    WalkRuleTree(this,ast_00,prultbl,ppass);
  }
  RefCount<AST>::~RefCount(ast_00);
switchD_001ccf57_caseD_4:
  return;
}

Assistant:

void GrcManager::WalkTableElement(RefAST ast, TableType tblt,
	GdlRuleTable * prultbl, GdlPass * ppass)
{
	int nodetyp = ast->getType();
	switch (nodetyp)
	{
	case LITERAL_environment:
		WalkEnvTree(ast, tblt, prultbl, ppass);
		break;
	case LITERAL_table:
		WalkTableTree(ast);
		break;
	case Zdirectives:
		WalkDirectivesTree(ast);
		break;
	case LITERAL_pass:
		Assert(prultbl);
		Assert(ktbltRule == tblt);
		WalkPassTree(ast, prultbl, ppass);
		break;
	case ZifStruct:
		Assert(prultbl);
		Assert(ktbltRule == tblt);
		WalkIfTree(ast, prultbl, ppass);
		break;
	case Zrule:
		Assert(prultbl);
		Assert(ktbltRule == tblt);
		WalkRuleTree(ast, prultbl, ppass);
		break;
	default:
		//	Assignment of some sort.
		switch (tblt)
		{
		case ktbltFeature:
			WalkFeatureTableElement(ast);
			break;
		case ktbltLanguage:
			WalkLanguageTableElement(ast);
			break;
		case ktbltName:
			WalkNameTableElement(ast);
			break;
		case ktbltGlyph:
			WalkGlyphTableElement(ast);
			break;
		case ktbltRule:
		default:
			Assert(false);
		}
	}
}